

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

void Commands::Paperdoll(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *arguments,Character *from)

{
  World *pWVar1;
  int iVar2;
  Character *this;
  PacketBuilder *this_00;
  long lVar3;
  PacketBuilder reply;
  string local_e0;
  string home_str;
  string rank_str;
  string guild_str;
  string local_60;
  string local_40;
  
  pWVar1 = from->world;
  std::__cxx11::string::string
            ((string *)&local_40,
             (string *)
             (arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  this = World::GetCharacter(pWVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (this == (Character *)0x0) {
    pWVar1 = from->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reply,"character_not_found",(allocator<char> *)&home_str);
    I18N::Format<>(&local_60,&pWVar1->i18n,(string *)&reply);
    (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    this_00 = &reply;
  }
  else {
    Character::HomeString_abi_cxx11_(&home_str,this);
    Character::GuildNameString_abi_cxx11_(&guild_str,this);
    Character::GuildRankString_abi_cxx11_(&rank_str,this);
    (*(this->super_Command_Source)._vptr_Command_Source[2])(&local_e0,this);
    PacketBuilder::PacketBuilder
              (&reply,PACKET_PAPERDOLL,PACKET_REPLY,
               rank_str._M_string_length +
               local_e0._M_string_length + home_str._M_string_length +
               (this->partner)._M_string_length + (this->title)._M_string_length +
               guild_str._M_string_length + 0x2a);
    std::__cxx11::string::~string((string *)&local_e0);
    (*(this->super_Command_Source)._vptr_Command_Source[2])(&local_e0,this);
    PacketBuilder::AddBreakString(&reply,&local_e0,0xff);
    std::__cxx11::string::~string((string *)&local_e0);
    PacketBuilder::AddBreakString(&reply,&home_str,0xff);
    PacketBuilder::AddBreakString(&reply,&this->partner,0xff);
    PacketBuilder::AddBreakString(&reply,&this->title,0xff);
    PacketBuilder::AddBreakString(&reply,&guild_str,0xff);
    PacketBuilder::AddBreakString(&reply,&rank_str,0xff);
    iVar2 = Character::PlayerID(this);
    PacketBuilder::AddShort(&reply,iVar2);
    PacketBuilder::AddChar(&reply,(uint)this->clas);
    PacketBuilder::AddChar(&reply,(uint)this->gender);
    PacketBuilder::AddChar(&reply,0);
    for (lVar3 = 0x2e8; lVar3 != 0x324; lVar3 = lVar3 + 4) {
      PacketBuilder::AddShort
                (&reply,*(int *)((long)&(this->super_Command_Source)._vptr_Command_Source + lVar3));
    }
    iVar2 = (*(this->super_Command_Source)._vptr_Command_Source[1])(this);
    if (((byte)iVar2 < 4) || ((this->hidden & 8) != 0)) {
      iVar2 = (*(this->super_Command_Source)._vptr_Command_Source[1])(this);
      if (((char)iVar2 == '\0') || ((this->hidden & 8) != 0)) {
        iVar2 = 6;
        if (this->party == (Party *)0x0) {
          iVar2 = 0;
        }
      }
      else {
        iVar2 = (uint)(this->party != (Party *)0x0) * 5 + 4;
      }
    }
    else {
      iVar2 = (uint)(this->party != (Party *)0x0) * 5 + 5;
    }
    PacketBuilder::AddChar(&reply,iVar2);
    Character::Send(from,&reply);
    PacketBuilder::~PacketBuilder(&reply);
    std::__cxx11::string::~string((string *)&rank_str);
    std::__cxx11::string::~string((string *)&guild_str);
    this_00 = (PacketBuilder *)&home_str;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void Paperdoll(const std::vector<std::string>& arguments, Character* from)
{
	Character *victim = from->world->GetCharacter(arguments[0]);

	if (!victim)
	{
		from->ServerMsg(from->world->i18n.Format("character_not_found"));
	}
	else
	{
		std::string home_str = victim->HomeString();
		std::string guild_str = victim->GuildNameString();
		std::string rank_str = victim->GuildRankString();

		PacketBuilder reply(PACKET_PAPERDOLL, PACKET_REPLY,
			12 + victim->SourceName().length() + home_str.length() + victim->partner.length() + victim->title.length()
			+ guild_str.length() + rank_str.length() + victim->paperdoll.size() * 2);

		reply.AddBreakString(victim->SourceName());
		reply.AddBreakString(home_str);
		reply.AddBreakString(victim->partner);
		reply.AddBreakString(victim->title);
		reply.AddBreakString(guild_str);
		reply.AddBreakString(rank_str);
		reply.AddShort(victim->PlayerID());
		reply.AddChar(victim->clas);
		reply.AddChar(victim->gender);
		reply.AddChar(0);

		UTIL_FOREACH(victim->paperdoll, item)
		{
			reply.AddShort(item);
		}

		if (victim->SourceDutyAccess() >= ADMIN_HGM && !victim->IsHideAdmin())
		{
			if (victim->party)
			{
				reply.AddChar(ICON_HGM_PARTY);
			}
			else
			{
				reply.AddChar(ICON_HGM);
			}
		}
		else if (victim->SourceDutyAccess() >= ADMIN_GUIDE && !victim->IsHideAdmin())
		{
			if (victim->party)
			{
				reply.AddChar(ICON_GM_PARTY);
			}
			else
			{
				reply.AddChar(ICON_GM);
			}
		}
		else
		{
			if (victim->party)
			{
				reply.AddChar(ICON_PARTY);
			}
			else
			{
				reply.AddChar(ICON_NORMAL);
			}
		}

		from->Send(reply);
	}
}